

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gens_opn2.cpp
# Opt level: O0

void __thiscall GensOPN2::nativeGenerateN(GensOPN2 *this,int16_t *output,size_t frames)

{
  int16_t local_860;
  int local_85c;
  int32_t **local_858;
  ulong uStack_840;
  int32_t sample;
  size_t i;
  int32_t *bufR;
  int32_t *bufL;
  int32_t bufLR [512];
  Ym2612 *chip;
  size_t frames_local;
  int16_t *output_local;
  GensOPN2 *this_local;
  
  if (0x100 < frames) {
    __assert_fail("frames <= maxFrames",
                  "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/thirdparty/libOPNMIDI/src/chips/gens_opn2.cpp"
                  ,0x54,"virtual void GensOPN2::nativeGenerateN(int16_t *, size_t)");
  }
  bufLR._2040_8_ = this->chip;
  memset(&bufL,0,0x800);
  LibGens::Ym2612::resetBufferPtrs((Ym2612 *)bufLR._2040_8_,(int32_t *)&bufL,bufLR + 0xfe);
  LibGens::Ym2612::addWriteLen((Ym2612 *)bufLR._2040_8_,(int)frames);
  LibGens::Ym2612::specialUpdate((Ym2612 *)bufLR._2040_8_);
  for (uStack_840 = 0; uStack_840 < frames << 1; uStack_840 = uStack_840 + 1) {
    local_858 = &bufL;
    if ((uStack_840 & 1) != 0) {
      local_858 = (int32_t **)(bufLR + 0xfe);
    }
    local_85c = *(int32_t *)((long)local_858 + (uStack_840 >> 1) * 4) / 4;
    if (local_85c < -0x8000) {
      local_85c = -0x8000;
    }
    if (local_85c < 0x8000) {
      local_860 = (int16_t)local_85c;
    }
    else {
      local_860 = 0x7fff;
    }
    output[uStack_840] = local_860;
  }
  return;
}

Assistant:

void GensOPN2::nativeGenerateN(int16_t *output, size_t frames)
{
    enum { maxFrames = 256 };
    assert(frames <= maxFrames);

    LibGens::Ym2612 *chip = this->chip;
    int32_t bufLR[2 * maxFrames] = {};
    int32_t *bufL = &bufLR[0];
    int32_t *bufR = &bufLR[maxFrames];

    chip->resetBufferPtrs(bufL, bufR);
    chip->addWriteLen((int)frames);
    chip->specialUpdate();

    //TODO
    // chip->updateDacAndTimers(bufL, bufR, frames);

    for (size_t i = 0; i < 2 * frames; ++i)
    {
        int32_t sample = ((i & 1) ? bufR : bufL)[i / 2];
        sample /= 4; // has too high volume, attenuation needed
        sample = (sample < INT16_MIN) ? INT16_MIN : sample;
        sample = (sample > INT16_MAX) ? INT16_MAX : sample;
        output[i] = (int16_t)sample;
    }
}